

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  TokenTypePair pair;
  reference pRVar3;
  reference pRVar4;
  bool local_e1;
  undefined1 local_c8 [8];
  ResolveFuncs it_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
  *__range1_1;
  undefined1 local_70 [8];
  ResolveTypes it;
  iterator __end1;
  iterator __begin1;
  vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_> *__range1;
  Result result;
  Module *module_local;
  WastParser *this_local;
  
  std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>::
  clear(&this->resolve_types_);
  std::vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>::
  clear(&this->resolve_funcs_);
  while( true ) {
    pair = PeekPair(this);
    bVar1 = anon_unknown_1::IsModuleField(pair);
    local_e1 = true;
    if (!bVar1) {
      local_e1 = PeekIsCustom(this);
    }
    if (local_e1 == false) break;
    bVar1 = PeekIsCustom(this);
    if (bVar1) {
      RVar2 = ParseCustomSectionAnnotation(this,module);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    else {
      result = ParseModuleField(this,module);
      bVar1 = Failed(result);
      if (bVar1) {
        __range1._4_4_ = Synchronize(this,anon_unknown_1::IsModuleField);
        bVar1 = Failed(__range1._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
      }
    }
  }
  Result::Result((Result *)&__range1,Ok);
  __end1 = std::
           vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>::
           begin(&this->resolve_types_);
  it.vars.
  super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
                ::end(&this->resolve_types_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<wabt::WastParser::ResolveTypes_*,_std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>_>
                                     *)&it.vars.
                                        super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)
  {
    pRVar3 = __gnu_cxx::
             __normal_iterator<wabt::WastParser::ResolveTypes_*,_std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>_>
             ::operator*(&__end1);
    ResolveTypes::ResolveTypes((ResolveTypes *)local_70,pRVar3);
    RVar2 = ResolveRefTypes(module,(TypeVector *)local_70,(ReferenceVars *)&it,this->errors_);
    Result::operator|=((Result *)&__range1,RVar2);
    ResolveTypes::~ResolveTypes((ResolveTypes *)local_70);
    __gnu_cxx::
    __normal_iterator<wabt::WastParser::ResolveTypes_*,_std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
             ::begin(&this->resolve_funcs_);
  it_1.vars.
  super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
                ::end(&this->resolve_funcs_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<wabt::WastParser::ResolveFuncs_*,_std::vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>_>
                             *)&it_1.vars.
                                super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
    pRVar4 = __gnu_cxx::
             __normal_iterator<wabt::WastParser::ResolveFuncs_*,_std::vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>_>
             ::operator*(&__end1_1);
    ResolveFuncs::ResolveFuncs((ResolveFuncs *)local_c8,pRVar4);
    RVar2 = ResolveRefTypes(module,(TypeVector *)&it_1,
                            (ReferenceVars *)
                            &it_1.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,this->errors_);
    Result::operator|=((Result *)&__range1,RVar2);
    LocalTypes::Set((LocalTypes *)((long)local_c8 + 0xa0),(TypeVector *)&it_1);
    ResolveFuncs::~ResolveFuncs((ResolveFuncs *)local_c8);
    __gnu_cxx::
    __normal_iterator<wabt::WastParser::ResolveFuncs_*,_std::vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>_>
    ::operator++(&__end1_1);
  }
  bVar1 = Failed(__range1._0_4_);
  if (!bVar1) {
    RVar2 = anon_unknown_1::ResolveFuncTypes(module,this->errors_);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    RVar2 = ResolveNamesModule(module,this->errors_);
    bVar1 = Failed(RVar2);
    if (!bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);

  // Reset module-specific state.
  resolve_types_.clear();
  resolve_funcs_.clear();

  while (IsModuleField(PeekPair()) || PeekIsCustom()) {
    if (PeekIsCustom()) {
      CHECK_RESULT(ParseCustomSectionAnnotation(module));
      continue;
    }
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }

  // Module parsing is completed, type names can be resolved now.
  Result result = Result::Ok;

  for (auto it : resolve_types_) {
    result |= ResolveRefTypes(*module, it.target_types, &it.vars, errors_);
  }

  for (auto it : resolve_funcs_) {
    result |= ResolveRefTypes(*module, &it.types, &it.vars, errors_);
    it.target_func->local_types.Set(it.types);
  }

  CHECK_RESULT(result);
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  return Result::Ok;
}